

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O1

bool __thiscall
iDynTree::AttitudeQuaternionEKF::setInitialStateCovariance
          (AttitudeQuaternionEKF *this,double orientation_var,double ang_vel_var,
          double gyro_bias_var)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  pointer peVar6;
  double *pdVar7;
  long lVar8;
  MatrixDynSize P;
  Span<double,__1L> P_span;
  MatrixDynSize local_80 [40];
  double local_58;
  double local_48;
  double local_38;
  Span<double,__1L> local_20;
  
  local_58 = orientation_var;
  local_48 = ang_vel_var;
  local_38 = gyro_bias_var;
  iDynTree::MatrixDynSize::MatrixDynSize(local_80,this->m_state_size,this->m_state_size);
  lVar4 = iDynTree::MatrixDynSize::data();
  iDynTree::MatrixDynSize::rows();
  lVar5 = iDynTree::MatrixDynSize::cols();
  pdVar7 = (double *)(lVar4 + 0x10);
  lVar8 = 0;
  do {
    pdVar1 = (double *)((long)(this->m_Id4).m_data + lVar8);
    dVar2 = pdVar1[1];
    pdVar7[-2] = *pdVar1 * local_58;
    pdVar7[-1] = dVar2 * local_58;
    pdVar1 = (double *)((long)(this->m_Id4).m_data + lVar8 + 0x10);
    dVar2 = pdVar1[1];
    *pdVar7 = *pdVar1 * local_58;
    pdVar7[1] = dVar2 * local_58;
    lVar8 = lVar8 + 0x20;
    pdVar7 = pdVar7 + lVar5;
  } while (lVar8 != 0x80);
  pdVar7 = (double *)(lVar5 * 0x20 + lVar4 + 0x30);
  lVar8 = 0;
  do {
    pdVar1 = (double *)((long)(this->m_Id3).m_data + lVar8);
    dVar2 = pdVar1[1];
    pdVar7[-2] = *pdVar1 * local_48;
    pdVar7[-1] = dVar2 * local_48;
    *pdVar7 = *(double *)((long)(this->m_Id3).m_data + lVar8 + 0x10) * local_48;
    lVar8 = lVar8 + 0x18;
    pdVar7 = pdVar7 + lVar5;
  } while (lVar8 != 0x48);
  pdVar7 = (double *)(lVar5 * 0x38 + lVar4 + 0x48);
  lVar4 = 0;
  do {
    pdVar1 = (double *)((long)(this->m_Id3).m_data + lVar4);
    dVar2 = pdVar1[1];
    pdVar7[-2] = *pdVar1 * local_38;
    pdVar7[-1] = dVar2 * local_38;
    *pdVar7 = *(double *)((long)(this->m_Id3).m_data + lVar4 + 0x10) * local_38;
    lVar4 = lVar4 + 0x18;
    pdVar7 = pdVar7 + lVar5;
  } while (lVar4 != 0x48);
  peVar6 = (pointer)iDynTree::MatrixDynSize::data();
  local_20.storage_.super_extent_type<_1L>.size_ = iDynTree::MatrixDynSize::capacity();
  local_20.storage_.data_ = peVar6;
  bVar3 = DiscreteExtendedKalmanFilterHelper::ekfSetStateCovariance
                    (&this->super_DiscreteExtendedKalmanFilterHelper,&local_20);
  iDynTree::MatrixDynSize::~MatrixDynSize(local_80);
  return bVar3;
}

Assistant:

bool iDynTree::AttitudeQuaternionEKF::setInitialStateCovariance(double orientation_var, double ang_vel_var, double gyro_bias_var)
{
    using iDynTree::toEigen;

    iDynTree::MatrixDynSize P(m_state_size, m_state_size);

    auto P_eig(toEigen(P));
    auto Id3(toEigen(m_Id3));
    auto Id4(toEigen(m_Id4));

    P_eig.block<4,4>(0,0) = Id4*orientation_var;
    P_eig.block<3,3>(4,4) = Id3*ang_vel_var;
    P_eig.block<3,3>(7,7) = Id3*gyro_bias_var;

    iDynTree::Span<double> P_span(P.data(), P.capacity());
    bool ok = ekfSetStateCovariance(P_span);
    return ok;
}